

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task32.cpp
# Opt level: O0

int prior(char str)

{
  char str_local;
  
  if (str != '*') {
    if ((str == '+') || (str == '-')) {
      return 0;
    }
    if (str != '/') {
      if (str == '^') {
        return 2;
      }
      return -1;
    }
  }
  return 1;
}

Assistant:

int prior(const char str) {
    switch (str){
        case '^':
            return 2;
        case '*':
        case '/':
            return 1;
        case '+':
        case '-':
            return 0;
        default:
            return -1;
    }
}